

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void doprev_message(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  nh_menuitem_conflict *pnVar4;
  int iVar5;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  char **output;
  int j;
  int output_count;
  nh_menuitem *_item_;
  char *msg;
  int turn;
  int i;
  int size;
  int icount;
  char buf [120];
  nh_menuitem_conflict *local_28;
  nh_menuitem *items;
  int local_18;
  int maxturn_width;
  int maxturn;
  int pos;
  int prevturn;
  int hist_msg_width;
  
  local_18 = 0;
  for (msg._4_4_ = 0; msg._4_4_ < histsize; msg._4_4_ = msg._4_4_ + 1) {
    iVar5 = (histpos + msg._4_4_ + 1) % histsize;
    if (local_18 < msghistory[iVar5].turn) {
      local_18 = msghistory[iVar5].turn;
    }
  }
  items._4_4_ = 0;
  for (; local_18 != 0; local_18 = local_18 / 10) {
    items._4_4_ = items._4_4_ + 1;
  }
  if ((int)items._4_4_ < 1) {
    items._4_4_ = 1;
  }
  maxturn = 0;
  i = 0;
  turn = 10;
  local_28 = (nh_menuitem_conflict *)malloc(0xa78);
  for (msg._4_4_ = 0; msg._4_4_ < histsize; msg._4_4_ = msg._4_4_ + 1) {
    iVar5 = (histpos + msg._4_4_ + 1) % histsize;
    if (msghistory[iVar5].turn != 0) {
      msg._0_4_ = msghistory[iVar5].turn;
      _item_ = (nh_menuitem *)msghistory[iVar5].msg;
      sVar3 = strlen((char *)_item_);
      if ((ulong)(long)(int)(0x49 - items._4_4_) < sVar3) {
        ui_wrap_text(0x49 - items._4_4_,(char *)_item_,(int *)((long)&output + 4),
                     (char ***)&_item__1);
        if ((uint)msg == maxturn) {
          uVar2._0_4_ = _item__1->id;
          uVar2._4_4_ = _item__1->role;
          snprintf((char *)&size,0x78,"\t%s",uVar2);
        }
        else {
          uVar1._0_4_ = _item__1->id;
          uVar1._4_4_ = _item__1->role;
          snprintf((char *)&size,0x78,"T:%*d\t%s",(ulong)items._4_4_,(ulong)(uint)msg,uVar1);
        }
        if (turn <= i) {
          turn = turn << 1;
          local_28 = (nh_menuitem_conflict *)realloc(local_28,(long)turn * 0x10c);
        }
        pnVar4 = local_28 + i;
        pnVar4->id = L'\0';
        pnVar4->role = MI_TEXT;
        pnVar4->accel = '\0';
        pnVar4->group_accel = '\0';
        pnVar4->selected = '\0';
        strcpy(pnVar4->caption,(char *)&size);
        for (output._0_4_ = 1; i = i + 1, (int)output < output._4_4_; output._0_4_ = (int)output + 1
            ) {
          snprintf((char *)&size,0x78,"\t%s",
                   *(undefined8 *)(_item__1->caption + (long)(int)output * 8 + -8));
          if (turn <= i) {
            turn = turn << 1;
            local_28 = (nh_menuitem_conflict *)realloc(local_28,(long)turn * 0x10c);
          }
          pnVar4 = local_28 + i;
          pnVar4->id = L'\0';
          pnVar4->role = MI_TEXT;
          pnVar4->accel = '\0';
          pnVar4->group_accel = '\0';
          pnVar4->selected = '\0';
          strcpy(pnVar4->caption,(char *)&size);
        }
        ui_free_wrap((char **)_item__1);
      }
      else {
        if ((uint)msg == maxturn) {
          snprintf((char *)&size,0x78,"\t%s",_item_);
        }
        else {
          snprintf((char *)&size,0x78,"T:%*d\t%s",(ulong)items._4_4_,(ulong)(uint)msg,_item_);
        }
        if (turn <= i) {
          turn = turn << 1;
          local_28 = (nh_menuitem_conflict *)realloc(local_28,(long)turn * 0x10c);
        }
        _j = local_28 + i;
        _j->id = L'\0';
        _j->role = MI_TEXT;
        _j->accel = '\0';
        _j->group_accel = '\0';
        _j->selected = '\0';
        strcpy(_j->caption,(char *)&size);
        i = i + 1;
      }
      maxturn = (uint)msg;
    }
  }
  curses_display_menu_bottom(local_28,i,"Message history:",L'\0',(wchar_t *)0x0);
  free(local_28);
  return;
}

Assistant:

void doprev_message(void)
{
    /* 80 chars - 2 (borders) - 2 (gutters) - "T:" - 1 (divider) */
    const int hist_msg_width = 73;

    int prevturn;
    int pos;
    int maxturn, maxturn_width;

    struct nh_menuitem *items;
    char buf[MSGLEN+1];
    int icount, size, i;

    /* keep the previous messages window within 80 characters */
    maxturn = 0;
    for (i = 0; i < histsize; i++) {
	pos = (histpos + i + 1) % histsize;
	if (msghistory[pos].turn > maxturn)
	    maxturn = msghistory[pos].turn;
    }
    maxturn_width = 0;
    while (maxturn) {
	maxturn_width++;
	maxturn /= 10;
    }
    if (maxturn_width < 1)
	maxturn_width = 1;

    /* Prevent duplicate turn stamps. */
    prevturn = 0;

    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    for (i = 0; i < histsize; i++) {
	int turn;
	const char *msg;

	pos = (histpos + i + 1) % histsize;

	if (!msghistory[pos].turn)
	    continue;

	turn = msghistory[pos].turn;
	msg = msghistory[pos].msg;

	if (strlen(msg) <= hist_msg_width - maxturn_width) {
	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, msg);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", msg);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);
	} else {
	    int output_count, j;
	    char **output;

	    ui_wrap_text(hist_msg_width - maxturn_width, msg, &output_count, &output);

	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, output[0]);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", output[0]);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);

	    for (j = 1; j < output_count; j++) {
		snprintf(buf, MSGLEN+1, "\t%s", output[j]);
		add_menu_txt(items, size, icount, buf, MI_TEXT);
	    }

	    ui_free_wrap(output);
	}

	prevturn = turn;
    }

    curses_display_menu_bottom(items, icount, "Message history:", PICK_NONE, NULL);
    free(items);
}